

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

_Bool container_is_full(container_t *c,uint8_t typecode)

{
  int iVar1;
  uint8_t in_SIL;
  container_t *in_RDI;
  uint8_t local_11;
  array_container_t *local_10;
  _Bool local_1;
  
  local_11 = in_SIL;
  local_10 = (array_container_t *)container_unwrap_shared(in_RDI,&local_11);
  if (local_11 == '\x01') {
    iVar1 = bitset_container_cardinality((bitset_container_t *)local_10);
    local_1 = iVar1 == 0x10000;
  }
  else if (local_11 == '\x02') {
    iVar1 = array_container_cardinality(local_10);
    local_1 = iVar1 == 0x10000;
  }
  else {
    local_1 = run_container_is_full((run_container_t *)local_10);
  }
  return local_1;
}

Assistant:

static inline bool container_is_full(const container_t *c, uint8_t typecode) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_cardinality(const_CAST_bitset(c)) ==
                   (1 << 16);
        case ARRAY_CONTAINER_TYPE:
            return array_container_cardinality(const_CAST_array(c)) ==
                   (1 << 16);
        case RUN_CONTAINER_TYPE:
            return run_container_is_full(const_CAST_run(c));
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}